

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O3

void CppUTestStore(void **function)

{
  UtestShell *pUVar1;
  TestTerminatorWithoutExceptions local_10;
  
  if (0x1f < pointerTableIndex) {
    pUVar1 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"Maximum number of function pointers installed!",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/TestPlugin.cpp"
               ,0x88);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  setlist[pointerTableIndex].orig_value = *function;
  setlist[pointerTableIndex].orig = function;
  pointerTableIndex = pointerTableIndex + 1;
  return;
}

Assistant:

void CppUTestStore(void**function)
{
    if (pointerTableIndex >= SetPointerPlugin::MAX_SET) {
        FAIL("Maximum number of function pointers installed!");
    }
    setlist[pointerTableIndex].orig_value = *function;
    setlist[pointerTableIndex].orig = function;
    pointerTableIndex++;
}